

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

uint16_t addip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ushort uVar1;
  uint uVar2;
  size_t ib;
  size_t ia;
  bool bVar3;
  
  uVar2 = 0;
  for (; nb != 0; nb = nb - 1) {
    bVar3 = na == 0;
    na = na - 1;
    if (bVar3) {
      __assert_fail("ia",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x486,"uint16_t addip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
    }
    uVar2 = uVar2 + b[nb - 1] + (uint)a[na];
    a[na] = (uint16_t)uVar2;
    uVar2 = uVar2 >> 0x10;
  }
  if ((na != 0) && ((short)uVar2 != 0)) {
    do {
      na = na - 1;
      uVar1 = a[na];
      uVar2 = uVar1 + 1;
      a[na] = (uint16_t)uVar2;
      if (na == 0) break;
    } while (uVar1 == 0xffff);
    uVar2 = uVar2 >> 0x10;
  }
  return (uint16_t)uVar2;
}

Assistant:

static uint16_t addip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	uint16_t carry = 0;
	size_t ia = na, ib = nb;

	while (ib > 0) {
		uint32_t t;

		assert(ia);
		--ia;
		--ib;
		t = (uint32_t)a[ia] + (uint32_t)b[ib] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	while (ia > 0 && carry) {
		uint32_t t;

		--ia;
		t = (uint32_t)a[ia] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	return carry;
}